

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

any * __thiscall cs_impl::any::operator=(any *this,any *var)

{
  proxy *ppVar1;
  
  if (this->mDat != var->mDat) {
    recycle(this);
    ppVar1 = var->mDat;
    if (ppVar1 != (proxy *)0x0) {
      ppVar1->refcount = ppVar1->refcount + 1;
    }
    this->mDat = ppVar1;
  }
  return this;
}

Assistant:

any &operator=(const any &var)
		{
			if (!is_same(var)) {
				recycle();
				mDat = var.duplicate();
			}
			return *this;
		}